

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddQuad(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *d,ImU32 col,
                   float thickness)

{
  ImVector<ImVec2> *this_00;
  
  if (col < 0x1000000) {
    return;
  }
  this_00 = &this->_Path;
  ImVector<ImVec2>::push_back(this_00,a);
  ImVector<ImVec2>::push_back(this_00,b);
  ImVector<ImVec2>::push_back(this_00,c);
  ImVector<ImVec2>::push_back(this_00,d);
  PathStroke(this,col,true,thickness);
  return;
}

Assistant:

void ImDrawList::AddQuad(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, ImU32 col, float thickness)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathLineTo(d);
    PathStroke(col, true, thickness);
}